

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_t::Generate(ast_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  uint uVar2;
  pointer ppaVar4;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)pc;
  ppaVar1 = (this->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar4 = (this->statements).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar4 != ppaVar1; ppaVar4 = ppaVar4 + 1) {
    uVar2 = (*(*ppaVar4)->_vptr_ast_item_t[2])(*ppaVar4,output,uVar3);
    uVar3 = (ulong)uVar2;
  }
  return (int)uVar3;
}

Assistant:

int ast_t::Generate(std::ostream& output, int pc) const 
  {
    for (auto item: this->statements) {
      pc = item->Generate(output, pc);
    }
    return pc;
  }